

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall HFactor::updateFT(HFactor *this,HVector *aq,HVector *ep,int iRow,int *hint)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  reference pvVar8;
  reference pvVar9;
  size_type sVar10;
  value_type *__x;
  vector<int,_std::allocator<int>_> *this_00;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int i_1;
  int iPut;
  int iTo;
  int iEnd;
  int iFrom;
  int new_space;
  int new_start;
  int row_count;
  int row_start;
  int iLogic_2;
  int k_2;
  int UendX;
  int UstartX;
  int i;
  int iLast_1;
  int iFind_1;
  int iLogic_1;
  int k_1;
  int iLast;
  int iFind;
  int iLogic;
  int k;
  double alpha;
  double pivot;
  int pLogic;
  value_type_conflict1 *in_stack_fffffffffffffe38;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe40;
  value_type_conflict1 *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  value_type vVar11;
  undefined4 in_stack_fffffffffffffe54;
  size_type in_stack_fffffffffffffe58;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe60;
  int local_ac;
  int local_78;
  int local_68;
  int local_5c;
  int local_54;
  int local_4c;
  int local_44;
  
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x398),(long)in_ECX);
  iVar2 = *pvVar8;
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x3c8),(long)iVar2);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)in_ECX);
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3b0),(long)iVar2);
  *pvVar8 = -1;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x460),(long)iVar2);
  iVar4 = *pvVar8;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x448),(long)iVar2);
  *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) - (iVar4 - *pvVar8);
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x448),(long)iVar2);
  for (local_44 = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x460),(long)iVar2),
      local_44 < *pvVar8; local_44 = local_44 + 1) {
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x490),(long)local_44);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x398),(long)*pvVar8);
    iVar4 = *pvVar8;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 1000),(long)iVar4);
    local_4c = *pvVar8;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x400),(long)iVar4);
    iVar4 = *pvVar8 + -1;
    *pvVar8 = iVar4;
    while ((local_4c <= iVar4 &&
           (pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x418),(long)local_4c
                               ), *pvVar8 != in_ECX))) {
      local_4c = local_4c + 1;
    }
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x418),(long)iVar4);
    vVar11 = *pvVar8;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x418),(long)local_4c);
    *pvVar8 = vVar11;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x430),(long)iVar4);
    vVar1 = *pvVar9;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x430),(long)local_4c);
    *pvVar9 = vVar1;
  }
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x400),(long)iVar2);
  iVar4 = *pvVar8;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 1000),(long)iVar2);
  *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) - (iVar4 - *pvVar8);
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 1000),(long)iVar2);
  for (local_54 = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x400),(long)iVar2),
      local_54 < *pvVar8; local_54 = local_54 + 1) {
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x418),(long)local_54);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x398),(long)*pvVar8);
    iVar4 = *pvVar8;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x448),(long)iVar4);
    local_5c = *pvVar8;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x460),(long)iVar4);
    iVar5 = *pvVar8 + -1;
    *pvVar8 = iVar5;
    while ((local_5c <= iVar5 &&
           (pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x490),(long)local_5c
                               ), *pvVar8 != in_ECX))) {
      local_5c = local_5c + 1;
    }
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x478),(long)iVar4);
    *pvVar8 = *pvVar8 + 1;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x490),(long)iVar5);
    vVar11 = *pvVar8;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x490),(long)local_5c);
    *pvVar8 = vVar11;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4a8),(long)iVar5);
    vVar1 = *pvVar9;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4a8),(long)local_5c);
    *pvVar9 = vVar1;
  }
  std::vector<int,_std::allocator<int>_>::size
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x418));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe40,
             (value_type *)in_stack_fffffffffffffe38);
  for (local_68 = 0; local_68 < *(int *)(in_RSI + 0x84); local_68 = local_68 + 1) {
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x88),(long)local_68);
    if (*pvVar8 != in_ECX) {
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x88),(long)local_68);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (value_type *)in_stack_fffffffffffffe48);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RSI + 0xa0),(long)local_68);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48);
    }
  }
  std::vector<int,_std::allocator<int>_>::size
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x418));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe40,
             (value_type *)in_stack_fffffffffffffe38);
  pvVar8 = std::vector<int,_std::allocator<int>_>::back
                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe40);
  local_78 = *pvVar8;
  pvVar8 = std::vector<int,_std::allocator<int>_>::back
                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe40);
  iVar4 = *pvVar8;
  *(int *)(in_RDI + 0x3e4) = (iVar4 - local_78) + 1 + *(int *)(in_RDI + 0x3e4);
  *(int *)(in_RDI + 8) = (iVar4 - local_78) + 1 + *(int *)(in_RDI + 8);
  for (; local_78 < iVar4; local_78 = local_78 + 1) {
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x418),(long)local_78);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x398),(long)*pvVar8);
    iVar5 = *pvVar8;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x478),(long)iVar5);
    if (*pvVar8 == 0) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x448),(long)iVar5);
      iVar3 = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x460),(long)iVar5);
      iVar6 = *pvVar8 - iVar3;
      sVar10 = std::vector<int,_std::allocator<int>_>::size
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x490));
      iVar7 = (int)sVar10;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60,
                 in_stack_fffffffffffffe58);
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x490),(long)iVar3);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x490),(long)(iVar3 + iVar6));
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x490),(long)iVar7);
      std::copy<int*,int*>
                ((int *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (int *)in_stack_fffffffffffffe48,(int *)in_stack_fffffffffffffe40);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4a8),(long)iVar3);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4a8),(long)(iVar3 + iVar6));
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4a8),(long)iVar7);
      std::copy<double*,double*>
                ((double *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48,(double *)in_stack_fffffffffffffe40);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x448),(long)iVar5);
      *pvVar8 = iVar7;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x460),(long)iVar5);
      *pvVar8 = iVar7 + iVar6;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x478),(long)iVar5);
      *pvVar8 = (int)((double)iVar6 * 1.1 + 5.0) - iVar6;
    }
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x478),(long)iVar5);
    *pvVar8 = *pvVar8 + -1;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x460),(long)iVar5);
    iVar5 = *pvVar8;
    *pvVar8 = iVar5 + 1;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x490),(long)iVar5);
    *pvVar8 = in_ECX;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x430),(long)local_78);
    vVar1 = *pvVar9;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4a8),(long)iVar5);
    *pvVar9 = vVar1;
  }
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x448),(long)iVar2);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (value_type *)in_stack_fffffffffffffe48);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x448),(long)iVar2);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (value_type *)in_stack_fffffffffffffe48);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x478),(long)iVar2);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x460),(long)iVar2);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x448),(long)iVar2);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe40,
             (value_type *)in_stack_fffffffffffffe38);
  sVar10 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3b0));
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x398),(long)in_ECX);
  *pvVar8 = (value_type)sVar10;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (value_type *)in_stack_fffffffffffffe48);
  std::vector<double,_std::allocator<double>_>::push_back
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  for (local_ac = 0; local_ac < *(int *)(in_RDX + 0x84); local_ac = local_ac + 1) {
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDX + 0x88),(long)local_ac);
    if (*pvVar8 != in_ECX) {
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDX + 0x88),(long)local_ac);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (value_type *)in_stack_fffffffffffffe48);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDX + 0xa0),(long)local_ac);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    }
  }
  __x = (value_type *)
        std::vector<int,_std::allocator<int>_>::size
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x508));
  pvVar8 = std::vector<int,_std::allocator<int>_>::back
                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe40);
  *(int *)(in_RDI + 0x3e4) = *(int *)(in_RDI + 0x3e4) + ((int)__x - *pvVar8);
  this_00 = (vector<int,_std::allocator<int>_> *)
            std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x508));
  pvVar8 = std::vector<int,_std::allocator<int>_>::back(this_00);
  *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + ((int)this_00 - *pvVar8) + 1;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (value_type *)in_stack_fffffffffffffe48);
  std::vector<int,_std::allocator<int>_>::size
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x508));
  std::vector<int,_std::allocator<int>_>::push_back(this_00,__x);
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x400),(long)iVar2);
  vVar11 = *pvVar8;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 1000),(long)iVar2);
  *(int *)(in_RDI + 0x3e4) = *(int *)(in_RDI + 0x3e4) - (vVar11 - *pvVar8);
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x460),(long)iVar2);
  vVar11 = *pvVar8;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x448),(long)iVar2);
  *(int *)(in_RDI + 0x3e4) = *(int *)(in_RDI + 0x3e4) - (vVar11 - *pvVar8);
  return;
}

Assistant:

void HFactor::updateFT(HVector *aq, HVector *ep, int iRow, int *hint) {
    // Store pivot
    int pLogic = UpivotLookup[iRow];
    double pivot = UpivotValue[pLogic];
    double alpha = aq->array[iRow];
    UpivotIndex[pLogic] = -1;

    // Delete pivotal row from U
    FtotalX -= URlastp[pLogic] - URstart[pLogic];
    for (int k = URstart[pLogic]; k < URlastp[pLogic]; k++) {
        // Find the pivotal position
        int iLogic = UpivotLookup[URindex[k]];
        int iFind = Ustart[iLogic];
        int iLast = --Ulastp[iLogic];
        for (; iFind <= iLast; iFind++)
            if (Uindex[iFind] == iRow)
                break;
        // Put last to find, and delete last
        Uindex[iFind] = Uindex[iLast];
        Uvalue[iFind] = Uvalue[iLast];
    }

    // Delete pivotal column from UR
    FtotalX -= Ulastp[pLogic] - Ustart[pLogic];
    for (int k = Ustart[pLogic]; k < Ulastp[pLogic]; k++) {
        // Find the pivotal position
        int iLogic = UpivotLookup[Uindex[k]];
        int iFind = URstart[iLogic];
        int iLast = --URlastp[iLogic];
        for (; iFind <= iLast; iFind++)
            if (URindex[iFind] == iRow)
                break;
        // Put last to find, and delete last
        URspace[iLogic]++;
        URindex[iFind] = URindex[iLast];
        URvalue[iFind] = URvalue[iLast];
    }

    // Store column to U
    Ustart.push_back(Uindex.size());
    for (int i = 0; i < aq->packCount; i++)
        if (aq->packIndex[i] != iRow) {
            Uindex.push_back(aq->packIndex[i]);
            Uvalue.push_back(aq->packValue[i]);
        }
    Ulastp.push_back(Uindex.size());
    int UstartX = Ustart.back();
    int UendX = Ulastp.back();
    UtotalX += UendX - UstartX + 1;
    FtotalX += UendX - UstartX + 1;

    // Store column as UR elements
    for (int k = UstartX; k < UendX; k++) {
        // Which ETA file
        int iLogic = UpivotLookup[Uindex[k]];

        // Move row to the end if necessary
        if (URspace[iLogic] == 0) {
            // Make pointers
            int row_start = URstart[iLogic];
            int row_count = URlastp[iLogic] - row_start;
            int new_start = URindex.size();
            int new_space = row_count * 1.1 + 5;

            // Check matrix UR
            URindex.resize(new_start + new_space);
            URvalue.resize(new_start + new_space);

            // Move elements
            int iFrom = row_start;
            int iEnd = row_start + row_count;
            int iTo = new_start;
            copy(&URindex[iFrom], &URindex[iEnd], &URindex[iTo]);
            copy(&URvalue[iFrom], &URvalue[iEnd], &URvalue[iTo]);

            // Save new pointers
            URstart[iLogic] = new_start;
            URlastp[iLogic] = new_start + row_count;
            URspace[iLogic] = new_space - row_count;
        }

        // Put into the next available space
        URspace[iLogic]--;
        int iPut = URlastp[iLogic]++;
        URindex[iPut] = iRow;
        URvalue[iPut] = Uvalue[k];
    }

    // Store UR pointers
    URstart.push_back(URstart[pLogic]);
    URlastp.push_back(URstart[pLogic]);
    URspace.push_back(URspace[pLogic] + URlastp[pLogic] - URstart[pLogic]);

    // Update pivot count
    UpivotLookup[iRow] = UpivotIndex.size();
    UpivotIndex.push_back(iRow);
    UpivotValue.push_back(pivot * alpha);

    // Store row_ep as R matrix
    for (int i = 0; i < ep->packCount; i++) {
        if (ep->packIndex[i] != iRow) {
            PFindex.push_back(ep->packIndex[i]);
            PFvalue.push_back(-ep->packValue[i] * pivot);
        }
    }
    UtotalX += PFindex.size() - PFstart.back();
    FtotalX += PFindex.size() - PFstart.back() + 1;

    // Store R matrix pivot
    PFpivotIndex.push_back(iRow);
    PFstart.push_back(PFindex.size());

    // Update total countX
    UtotalX -= Ulastp[pLogic] - Ustart[pLogic];
    UtotalX -= URlastp[pLogic] - URstart[pLogic];

//    // See if we want refactor
//    if (UtotalX > UmeritX && PFpivotIndex.size() > 100)
//        *hint = 1;
}